

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O1

bool __thiscall
cmMessageCommand::InitialPass
          (cmMessageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmState *delimiter;
  pointer pbVar2;
  pointer pbVar3;
  cmMakefile *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  cmMessenger *this_00;
  MessageType t;
  string message;
  string local_a8;
  string local_88;
  undefined1 local_68 [17];
  undefined7 uStack_57;
  cmMakefile *local_48;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_40;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar3) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto LAB_002da905;
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)pbVar2);
    if (iVar8 == 0) {
      t = FATAL_ERROR;
LAB_002da5be:
      local_40.Begin._M_current = pbVar2 + 1;
      bVar7 = false;
LAB_002da5c0:
      bVar5 = false;
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)pbVar2);
      if (iVar8 != 0) {
        iVar8 = std::__cxx11::string::compare((char *)pbVar2);
        if (iVar8 == 0) {
          t = WARNING;
          goto LAB_002da5be;
        }
        iVar8 = std::__cxx11::string::compare((char *)pbVar2);
        if (iVar8 == 0) {
          pcVar4 = (this->super_cmCommand).Makefile;
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"CMAKE_SUPPRESS_DEVELOPER_ERRORS","");
          bVar7 = cmMakefile::IsSet(pcVar4,&local_a8);
          if (bVar7) {
            pcVar4 = (this->super_cmCommand).Makefile;
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,"CMAKE_SUPPRESS_DEVELOPER_ERRORS","");
            bVar5 = cmMakefile::IsOn(pcVar4,&local_88);
            bVar5 = !bVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            bVar5 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          t = AUTHOR_ERROR;
          if (bVar5 == false) {
            pcVar4 = (this->super_cmCommand).Makefile;
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
            bVar7 = cmMakefile::IsOn(pcVar4,&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            t = AUTHOR_WARNING;
            if (bVar7) goto LAB_002da905;
          }
          goto LAB_002da824;
        }
        iVar8 = std::__cxx11::string::compare((char *)pbVar2);
        if (iVar8 == 0) {
          local_40.Begin._M_current = pbVar2 + 1;
          bVar7 = true;
          t = MESSAGE;
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)pbVar2);
          if (iVar8 == 0) {
            pcVar4 = (this->super_cmCommand).Makefile;
            paVar1 = &local_a8.field_2;
            local_a8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"CMAKE_ERROR_DEPRECATED","");
            bVar5 = cmMakefile::IsOn(pcVar4,&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != paVar1) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            t = DEPRECATION_ERROR;
            if (!bVar5) {
              pcVar4 = (this->super_cmCommand).Makefile;
              local_a8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a8,"CMAKE_WARN_DEPRECATED","");
              bVar6 = cmMakefile::IsSet(pcVar4,&local_a8);
              bVar7 = true;
              if (bVar6) {
                local_48 = (this->super_cmCommand).Makefile;
                local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_88,"CMAKE_WARN_DEPRECATED","");
                bVar7 = cmMakefile::IsOn(local_48,&local_88);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != paVar1) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              t = DEPRECATION_WARNING;
              if (bVar7 == false) goto LAB_002da905;
            }
            goto LAB_002da824;
          }
          t = MESSAGE;
          bVar7 = false;
          local_40.Begin._M_current = pbVar2;
        }
        goto LAB_002da5c0;
      }
      bVar5 = true;
      t = FATAL_ERROR;
LAB_002da824:
      local_40.Begin._M_current = pbVar2 + 1;
      bVar7 = false;
    }
    local_40.End._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    delimiter = (cmState *)(local_68 + 0x10);
    local_68._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
    local_68[0x10] = 0;
    local_68._0_8_ = delimiter;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_a8,&local_40,(char *)delimiter);
    if ((cmState *)local_68._0_8_ != delimiter) {
      operator_delete((void *)local_68._0_8_,CONCAT71(uStack_57,local_68[0x10]) + 1);
    }
    if (t == MESSAGE) {
      if (bVar7) {
        cmMakefile::DisplayStatus((this->super_cmCommand).Makefile,local_a8._M_dataplus._M_p,-1.0);
      }
      else {
        cmSystemTools::Message(local_a8._M_dataplus._M_p,(char *)0x0);
      }
    }
    else {
      this_00 = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
      cmMakefile::GetBacktrace((cmListFileBacktrace *)local_68,(this->super_cmCommand).Makefile);
      cmMessenger::DisplayMessage(this_00,t,&local_a8,(cmListFileBacktrace *)local_68);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_68);
    }
    if (bVar5 != false) {
      cmSystemTools::s_FatalErrorOccured = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto LAB_002da905;
  }
  operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
LAB_002da905:
  return pbVar2 != pbVar3;
}

Assistant:

bool cmMessageCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string>::const_iterator i = args.begin();

  cmake::MessageType type = cmake::MESSAGE;
  bool status = false;
  bool fatal = false;
  if (*i == "SEND_ERROR") {
    type = cmake::FATAL_ERROR;
    ++i;
  } else if (*i == "FATAL_ERROR") {
    fatal = true;
    type = cmake::FATAL_ERROR;
    ++i;
  } else if (*i == "WARNING") {
    type = cmake::WARNING;
    ++i;
  } else if (*i == "AUTHOR_WARNING") {
    if (this->Makefile->IsSet("CMAKE_SUPPRESS_DEVELOPER_ERRORS") &&
        !this->Makefile->IsOn("CMAKE_SUPPRESS_DEVELOPER_ERRORS")) {
      fatal = true;
      type = cmake::AUTHOR_ERROR;
    } else if (!this->Makefile->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
      type = cmake::AUTHOR_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "STATUS") {
    status = true;
    ++i;
  } else if (*i == "DEPRECATION") {
    if (this->Makefile->IsOn("CMAKE_ERROR_DEPRECATED")) {
      fatal = true;
      type = cmake::DEPRECATION_ERROR;
    } else if ((!this->Makefile->IsSet("CMAKE_WARN_DEPRECATED") ||
                this->Makefile->IsOn("CMAKE_WARN_DEPRECATED"))) {
      type = cmake::DEPRECATION_WARNING;
    } else {
      return true;
    }
    ++i;
  }

  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());

  if (type != cmake::MESSAGE) {
    // we've overriden the message type, above, so display it directly
    cmMessenger* m = this->Makefile->GetMessenger();
    m->DisplayMessage(type, message, this->Makefile->GetBacktrace());
  } else {
    if (status) {
      this->Makefile->DisplayStatus(message.c_str(), -1);
    } else {
      cmSystemTools::Message(message.c_str());
    }
  }
  if (fatal) {
    cmSystemTools::SetFatalErrorOccured();
  }
  return true;
}